

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int uv_pipe_pending_count(uv_pipe_t *handle)

{
  uv__stream_queued_fds_t *queued_fds;
  uv_pipe_t *handle_local;
  
  if (handle->ipc == 0) {
    handle_local._4_4_ = 0;
  }
  else if (handle->accepted_fd == -1) {
    handle_local._4_4_ = 0;
  }
  else if (handle->queued_fds == (void *)0x0) {
    handle_local._4_4_ = 1;
  }
  else {
    handle_local._4_4_ = *(int *)((long)handle->queued_fds + 4) + 1;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_pipe_pending_count(uv_pipe_t* handle) {
  uv__stream_queued_fds_t* queued_fds;

  if (!handle->ipc)
    return 0;

  if (handle->accepted_fd == -1)
    return 0;

  if (handle->queued_fds == NULL)
    return 1;

  queued_fds = handle->queued_fds;
  return queued_fds->offset + 1;
}